

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

char * filename_cut(char *line,size_t len)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  
  if (line == (char *)0x0) {
    __assert_fail("line",
                  "/workspace/llm4binary/github/license_c_cmakelists/thpatch[P]thtk/thanm.old/thanm.c"
                  ,0x397,"char *filename_cut(char *, size_t)");
  }
  if (len == 0) {
    lVar2 = 0;
    pcVar3 = line;
    pcVar5 = line;
  }
  else {
    pcVar3 = line + len;
    lVar2 = 0;
    do {
      if ((*line != '\t') && (*line != ' ')) {
        lVar2 = 0;
        sVar4 = 0;
        pcVar3 = line;
        goto LAB_001086d0;
      }
      line = line + 1;
      len = len - 1;
      pcVar5 = pcVar3;
    } while (len != 0);
  }
  goto LAB_001086fa;
LAB_001086d0:
  do {
    cVar1 = line[sVar4];
    pcVar5 = line;
    if ((cVar1 != '\t') && (cVar1 != ' ')) {
      if (cVar1 == '\n') {
        lVar2 = 1;
        break;
      }
      pcVar3 = line + sVar4;
    }
    sVar4 = sVar4 + 1;
  } while (len != sVar4);
LAB_001086fa:
  pcVar3[lVar2] = '\0';
  return pcVar5;
}

Assistant:

static char*
filename_cut(
    char *line,
    size_t len)
{
    char *p = line;

    assert(line);

    if(len == 0) {
        return line;
    }

    /* isspace(3) is only asking for trouble; we don't parse Unicode anyway. */
#define is_space(c) (c == ' ' || c == '\t')

    while(len > 0 && is_space(*p)) {
        len--;
        p++;
    }

    char *start = p;
    char *end = p;

    while(len > 0 && *p != '\n') {
        if(!is_space(*p)) {
            end = p;
        }
        len--;
        p++;
    }

#undef is_space

    end[len == 0 ? 0 : 1] = '\0';
    return start;
}